

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Promise<void> __thiscall kj::anon_unknown_36::HttpOutputStream::flush(HttpOutputStream *this)

{
  PromiseArenaMember *pPVar1;
  _func_int **pp_Var2;
  long in_RSI;
  ForkedPromise<void> fork;
  PromiseArenaMember *local_48;
  PromiseBase local_40;
  _func_int **local_38;
  char *local_30;
  char *pcStack_28;
  Event **local_20;
  
  local_30 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  pcStack_28 = "flush";
  local_20 = (Event **)0x1100000934;
  Promise<void>::fork((Promise<void> *)&stack0xffffffffffffffc0);
  kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)&stack0xffffffffffffffb8);
  pPVar1 = *(PromiseArenaMember **)(in_RSI + 0x10);
  *(PromiseArenaMember **)(in_RSI + 0x10) = local_48;
  local_48 = (PromiseArenaMember *)0x0;
  if (pPVar1 != (PromiseArenaMember *)0x0) {
    kj::_::PromiseDisposer::dispose(pPVar1);
  }
  pPVar1 = local_48;
  if (local_48 != (PromiseArenaMember *)0x0) {
    local_48 = (PromiseArenaMember *)0x0;
    kj::_::PromiseDisposer::dispose(pPVar1);
  }
  kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)this);
  pp_Var2 = local_38;
  if (local_38 != (_func_int **)0x0) {
    local_38 = (_func_int **)0x0;
    (**(((PromiseNode *)local_40.node.ptr)->super_PromiseArenaMember)._vptr_PromiseArenaMember)
              (local_40.node.ptr,(long)pp_Var2 + *(long *)(*pp_Var2 + -0x10));
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> flush() {
    auto fork = writeQueue.fork();
    writeQueue = fork.addBranch();
    return fork.addBranch();
  }